

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_handle.h
# Opt level: O0

WeakHandle<polyscope::Widget> * __thiscall
polyscope::WeakReferrable::getWeakHandle<polyscope::Widget>(WeakReferrable *this,Widget *targetPtr)

{
  WeakHandle<polyscope::Widget> *this_00;
  runtime_error *this_01;
  long in_RDX;
  long in_RSI;
  WeakHandle<polyscope::Widget> *in_RDI;
  Widget *in_stack_ffffffffffffff78;
  shared_ptr<int> *in_stack_ffffffffffffff80;
  shared_ptr<int> *this_02;
  shared_ptr<int> *in_stack_ffffffffffffff88;
  WeakHandle<polyscope::Widget> *in_stack_ffffffffffffff90;
  shared_ptr<int> local_48 [3];
  WeakHandle<polyscope::Widget> *local_18;
  
  if (in_RDX == 0) {
    if (in_RSI == 0) {
      this_00 = (WeakHandle<polyscope::Widget> *)0x0;
    }
    else {
      this_00 = (WeakHandle<polyscope::Widget> *)
                __dynamic_cast(in_RSI,&typeinfo,&Widget::typeinfo,0xffffffffffffffff);
    }
    local_18 = this_00;
    if (this_00 == (WeakHandle<polyscope::Widget> *)0x0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"[Polyscope] bad getWeakHandle() cast");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_02 = local_48;
    std::shared_ptr<int>::shared_ptr(this_02,(shared_ptr<int> *)in_stack_ffffffffffffff78);
    WeakHandle<polyscope::Widget>::WeakHandle
              (this_00,in_stack_ffffffffffffff88,(uint64_t)this_02,in_stack_ffffffffffffff78);
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x3eec0d);
  }
  else {
    std::shared_ptr<int>::shared_ptr
              (in_stack_ffffffffffffff80,(shared_ptr<int> *)in_stack_ffffffffffffff78);
    WeakHandle<polyscope::Widget>::WeakHandle
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (uint64_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x3eeb09);
  }
  return in_RDI;
}

Assistant:

WeakHandle<TargetType> getWeakHandle(TargetType* targetPtr = nullptr) {

    // in the case where we already had a pointer to the target type, just directly generate the wrapper
    if (targetPtr) {
      return WeakHandle<TargetType>(weakReferrableDummyRef, weakReferableUniqueID, targetPtr);
    }

    // otherwise, dynamic_cast to resolve the desired type
    targetPtr = dynamic_cast<TargetType*>(this); // sorry, world
    if (!targetPtr) throw std::runtime_error("[Polyscope] bad getWeakHandle() cast");
    return WeakHandle<TargetType>(weakReferrableDummyRef, weakReferableUniqueID, targetPtr);
  }